

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

int Ssw_SmlNodesCompareInFrame
              (Ssw_Sml_t *p,Aig_Obj_t *pObj0,Aig_Obj_t *pObj1,int iFrame0,int iFrame1)

{
  int iVar1;
  long lVar2;
  
  if (p->nFrames <= iFrame0) {
    __assert_fail("iFrame0 < p->nFrames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x308,
                  "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)")
    ;
  }
  if (p->nFrames <= iFrame1) {
    __assert_fail("iFrame1 < p->nFrames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x309,
                  "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)")
    ;
  }
  if (((ulong)pObj0 & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x30a,
                  "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)")
    ;
  }
  if (((ulong)pObj1 & 1) == 0) {
    if ((iFrame0 != 0) && (p->nWordsTotal <= p->nWordsFrame)) {
      __assert_fail("iFrame0 == 0 || p->nWordsFrame < p->nWordsTotal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                    ,0x30c,
                    "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)"
                   );
    }
    if ((iFrame1 != 0) && (p->nWordsTotal <= p->nWordsFrame)) {
      __assert_fail("iFrame1 == 0 || p->nWordsFrame < p->nWordsTotal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                    ,0x30d,
                    "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)"
                   );
    }
    iVar1 = p->nWordsFrame;
    if (0 < (long)iVar1) {
      lVar2 = 0;
      do {
        if (*(int *)((long)&p[1].pAig +
                    lVar2 * 4 + (long)(iFrame0 * iVar1) * 4 + (long)(pObj0->Id * p->nWordsTotal) * 4
                    ) !=
            *(int *)((long)&p[1].pAig +
                    lVar2 * 4 + (long)(iFrame1 * iVar1) * 4 + (long)(p->nWordsTotal * pObj1->Id) * 4
                    )) {
          return 0;
        }
        lVar2 = lVar2 + 1;
      } while (iVar1 != lVar2);
    }
    return 1;
  }
  __assert_fail("!Aig_IsComplement(pObj1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                ,0x30b,
                "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
}

Assistant:

int Ssw_SmlNodesCompareInFrame( Ssw_Sml_t * p, Aig_Obj_t * pObj0, Aig_Obj_t * pObj1, int iFrame0, int iFrame1 )
{
    unsigned * pSims0, * pSims1;
    int i;
    assert( iFrame0 < p->nFrames );
    assert( iFrame1 < p->nFrames );
    assert( !Aig_IsComplement(pObj0) );
    assert( !Aig_IsComplement(pObj1) );
    assert( iFrame0 == 0 || p->nWordsFrame < p->nWordsTotal );
    assert( iFrame1 == 0 || p->nWordsFrame < p->nWordsTotal );
    // get hold of the simulation information
    pSims0  = Ssw_ObjSim(p, pObj0->Id) + p->nWordsFrame * iFrame0;
    pSims1  = Ssw_ObjSim(p, pObj1->Id) + p->nWordsFrame * iFrame1;
    // compare
    for ( i = 0; i < p->nWordsFrame; i++ )
        if ( pSims0[i] != pSims1[i] )
            return 0;
    return 1;
}